

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t intersection_uint32_card(uint32_t *A,size_t lenA,uint32_t *B,size_t lenB)

{
  uint32_t *endB;
  uint32_t *endA;
  size_t card;
  size_t lenB_local;
  uint32_t *B_local;
  size_t lenA_local;
  uint32_t *A_local;
  
  if ((lenA == 0) || (lenB == 0)) {
    A_local = (uint32_t *)0x0;
  }
  else {
    endA = (uint32_t *)0x0;
    lenB_local = (size_t)B;
    lenA_local = (size_t)A;
    do {
      while (*(uint *)lenB_local <= *(uint *)lenA_local) {
        while (*(uint *)lenB_local < *(uint *)lenA_local) {
          lenB_local = lenB_local + 4;
          if ((uint32_t *)lenB_local == B + lenB) {
            return (size_t)endA;
          }
        }
        if (*(int *)lenA_local != *(int *)lenB_local) break;
        endA = (uint32_t *)((long)endA + 1);
        lenA_local = lenA_local + 4;
        if ((uint32_t *)lenA_local == A + lenA) {
          return (size_t)endA;
        }
        lenB_local = lenB_local + 4;
        if ((uint32_t *)lenB_local == B + lenB) {
          return (size_t)endA;
        }
      }
      lenA_local = lenA_local + 4;
    } while ((uint32_t *)lenA_local != A + lenA);
    A_local = endA;
  }
  return (size_t)A_local;
}

Assistant:

size_t intersection_uint32_card(const uint32_t *A, const size_t lenA,
                                const uint32_t *B, const size_t lenB) {
    if (lenA == 0 || lenB == 0) return 0;
    size_t card = 0;
    const uint32_t *endA = A + lenA;
    const uint32_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return card;
        }
        while (*A > *B) {
            if (++B == endB) return card;
        }
        if (*A == *B) {
            card++;
            if (++A == endA || ++B == endB) return card;
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    return card;  // NOTREACHED
}